

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketLip.cpp
# Opt level: O3

int BaseSocket::EnumIpAddresses
              (function<int_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_void_*)>
               *fnCallBack,void *vpUser)

{
  int iVar1;
  _Any_data local_30;
  _Manager_type local_20;
  
  std::
  function<int_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_void_*)>
  ::function((function<int_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_void_*)>
              *)&local_30,fnCallBack);
  iVar1 = BaseSocketImpl::EnumIpAddresses
                    ((function<int_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_void_*)>
                      *)&local_30,vpUser);
  if (local_20 != (code *)0x0) {
    (*local_20)(&local_30,&local_30,__destroy_functor);
  }
  return iVar1;
}

Assistant:

int BaseSocket::EnumIpAddresses(std::function<int(int, const std::string&, int, void*)> fnCallBack, void* vpUser)
{
    return BaseSocketImpl::EnumIpAddresses(fnCallBack, vpUser);
}